

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O0

QSizeF __thiscall QGridLayoutItem::effectiveMaxSize(QGridLayoutItem *this,QSizeF *constraint)

{
  QSizeF QVar1;
  bool bVar2;
  bool bVar3;
  qreal *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  bool hGrow;
  bool vGrow;
  QSizeF maxSize;
  QSizeF pref;
  QSizeF size;
  PolicyFlag in_stack_ffffffffffffff8c;
  PolicyFlag in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QSizeF local_40;
  QSizeF local_30;
  undefined4 local_20;
  undefined4 local_1c;
  QSizeF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.wd = *in_RSI;
  local_18.ht = in_RSI[1];
  local_1c = (**(code **)(*in_RDI + 0x10))(in_RDI,2);
  QFlags<QLayoutPolicy::PolicyFlag>::operator&
            ((QFlags<QLayoutPolicy::PolicyFlag> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c
            );
  bVar2 = ::operator==((QFlagsStorageHelper<QLayoutPolicy::PolicyFlag,_4>)
                       SUB84((ulong)in_RDI >> 0x20,0),in_stack_ffffffffffffff90);
  local_20 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
  QFlags<QLayoutPolicy::PolicyFlag>::operator&
            ((QFlags<QLayoutPolicy::PolicyFlag> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c
            );
  bVar3 = ::operator==((QFlagsStorageHelper<QLayoutPolicy::PolicyFlag,_4>)
                       SUB84((ulong)in_RDI >> 0x20,0),in_stack_ffffffffffffff90);
  if ((!bVar2) || (!bVar3)) {
    local_30.wd = -NAN;
    local_30.ht = -NAN;
    local_30.wd = (qreal)(**(code **)(*in_RDI + 0x18))(in_RDI,1,in_RSI);
    if (!bVar2) {
      qVar4 = QSizeF::height(&local_30);
      QSizeF::setHeight(&local_18,qVar4);
    }
    if (!bVar3) {
      qVar4 = QSizeF::width(&local_30);
      QSizeF::setWidth(&local_18,qVar4);
    }
  }
  bVar2 = QSizeF::isValid(&local_18);
  if (!bVar2) {
    local_40.wd = -NAN;
    local_40.ht = -NAN;
    local_40.wd = (qreal)(**(code **)(*in_RDI + 0x18))(in_RDI,2,&local_18);
    qVar4 = QSizeF::width(&local_18);
    if ((qVar4 == -1.0) && (!NAN(qVar4))) {
      qVar4 = QSizeF::width(&local_40);
      QSizeF::setWidth(&local_18,qVar4);
    }
    qVar4 = QSizeF::height(&local_18);
    if ((qVar4 == -1.0) && (!NAN(qVar4))) {
      qVar4 = QSizeF::height(&local_40);
      QSizeF::setHeight(&local_18,qVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.ht._0_4_ = SUB84(local_18.ht,0);
  QVar1.wd = local_18.wd;
  QVar1.ht._4_4_ = (int)((ulong)local_18.ht >> 0x20);
  return QVar1;
}

Assistant:

QSizeF QGridLayoutItem::effectiveMaxSize(const QSizeF &constraint) const
{
    QSizeF size = constraint;
    bool vGrow = (sizePolicy(Qt::Vertical) & QLayoutPolicy::GrowFlag) == QLayoutPolicy::GrowFlag;
    bool hGrow = (sizePolicy(Qt::Horizontal) & QLayoutPolicy::GrowFlag) == QLayoutPolicy::GrowFlag;
    if (!vGrow || !hGrow) {
        QSizeF pref = sizeHint(Qt::PreferredSize, constraint);
        if (!vGrow)
            size.setHeight(pref.height());
        if (!hGrow)
            size.setWidth(pref.width());
    }

    if (!size.isValid()) {
        QSizeF maxSize = sizeHint(Qt::MaximumSize, size);
        if (size.width() == -1)
            size.setWidth(maxSize.width());
        if (size.height() == -1)
            size.setHeight(maxSize.height());
    }
    return size;
}